

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atmosphere.h
# Opt level: O0

void __thiscall
Atmosphere::print_tabular(Atmosphere *this,double h_start,double h_end,double h_step)

{
  int size_00;
  double **table;
  int local_38;
  int i;
  int size;
  double **result;
  double h_step_local;
  double h_end_local;
  double h_start_local;
  Atmosphere *this_local;
  
  table = tabulate(this,h_start,h_end,h_step);
  size_00 = (int)((h_end - h_start) / h_step + 1.0);
  print_tabular(table,size_00);
  for (local_38 = 0; local_38 < size_00; local_38 = local_38 + 1) {
    if (table[local_38] != (double *)0x0) {
      operator_delete__(table[local_38]);
    }
  }
  if (table != (double **)0x0) {
    operator_delete__(table);
  }
  return;
}

Assistant:

void print_tabular(double h_start, double h_end, double h_step) {
        double **result = this->tabulate(h_start, h_end, h_step);
        const int size = (const int) ((h_end - h_start) / h_step + 1);
        Atmosphere::print_tabular(result, size);

        //Free each sub-array
        for (int i = 0; i < size; ++i) {
            delete[] result[i];
        }
        //Free the array of pointers
        delete[] result;

    }